

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O3

int SUNLinSolInitialize_SPGMR(SUNLinearSolver S)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  N_Vector *pp_Var4;
  void *pvVar5;
  undefined8 uVar6;
  ulong uVar7;
  
  if (S == (SUNLinearSolver)0x0) {
    return -1;
  }
  puVar2 = (uint *)S->content;
  if ((int)puVar2[3] < 0) {
    puVar2[3] = 0;
  }
  if (2 < puVar2[1] - 1) {
    puVar2[1] = 0;
  }
  if (*(long *)(puVar2 + 0x18) == 0) {
    pp_Var4 = N_VCloneVectorArray(*puVar2 + 1,*(N_Vector *)(puVar2 + 0x22));
    *(N_Vector **)(puVar2 + 0x18) = pp_Var4;
    if (pp_Var4 != (N_Vector *)0x0) goto LAB_00119bc9;
LAB_00119cd9:
    SUNLinSolFree(S);
    iVar3 = -3;
    uVar6 = 0xfffffffffffffffd;
  }
  else {
LAB_00119bc9:
    if (*(long *)(puVar2 + 0x1a) == 0) {
      uVar1 = *puVar2;
      pvVar5 = malloc((long)(int)(uVar1 + 1) << 3);
      *(void **)(puVar2 + 0x1a) = pvVar5;
      if (pvVar5 == (void *)0x0) goto LAB_00119cd9;
      if (-1 < (int)uVar1) {
        uVar7 = 0;
        do {
          *(undefined8 *)((long)pvVar5 + uVar7 * 8) = 0;
          pvVar5 = malloc((ulong)uVar1 << 3);
          *(void **)(*(long *)(puVar2 + 0x1a) + uVar7 * 8) = pvVar5;
          pvVar5 = *(void **)(puVar2 + 0x1a);
          if (*(long *)((long)pvVar5 + uVar7 * 8) == 0) goto LAB_00119cd9;
          uVar7 = uVar7 + 1;
        } while (uVar1 + 1 != uVar7);
      }
    }
    if (*(long *)(puVar2 + 0x1c) == 0) {
      pvVar5 = malloc((long)(int)*puVar2 << 4);
      *(void **)(puVar2 + 0x1c) = pvVar5;
      if (pvVar5 == (void *)0x0) goto LAB_00119cd9;
    }
    if (*(long *)(puVar2 + 0x20) == 0) {
      pvVar5 = malloc((long)(int)*puVar2 * 8 + 8);
      *(void **)(puVar2 + 0x20) = pvVar5;
      if (pvVar5 == (void *)0x0) goto LAB_00119cd9;
    }
    if (*(long *)(puVar2 + 0x24) == 0) {
      pvVar5 = malloc((long)(int)*puVar2 * 8 + 8);
      *(void **)(puVar2 + 0x24) = pvVar5;
      if (pvVar5 == (void *)0x0) goto LAB_00119cd9;
    }
    if (*(long *)(puVar2 + 0x26) == 0) {
      pvVar5 = malloc((long)(int)*puVar2 * 8 + 8);
      *(void **)(puVar2 + 0x26) = pvVar5;
      if (pvVar5 == (void *)0x0) goto LAB_00119cd9;
    }
    uVar6 = 0;
    iVar3 = 0;
  }
  *(undefined8 *)(puVar2 + 8) = uVar6;
  return iVar3;
}

Assistant:

int SUNLinSolInitialize_SPGMR(SUNLinearSolver S)
{
  int k;
  SUNLinearSolverContent_SPGMR content;

  /* set shortcut to SPGMR memory structure */
  if (S == NULL) return(SUNLS_MEM_NULL);  
  content = SPGMR_CONTENT(S);

  /* ensure valid options */
  if (content->max_restarts < 0) 
    content->max_restarts = SUNSPGMR_MAXRS_DEFAULT;
  if ( (content->pretype != PREC_LEFT) && 
       (content->pretype != PREC_RIGHT) && 
       (content->pretype != PREC_BOTH) )
    content->pretype = PREC_NONE;


  /* allocate solver-specific memory (where the size depends on the
     choice of maxl) here */

  /*   Krylov subspace vectors */
  if (content->V == NULL) {
    content->V = N_VCloneVectorArray(content->maxl+1, content->vtemp);
    if (content->V == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }
  
  /*   Hessenberg matrix Hes */
  if (content->Hes == NULL) {
    content->Hes = (realtype **) malloc((content->maxl+1)*sizeof(realtype *)); 
    if (content->Hes == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }

    for (k=0; k<=content->maxl; k++) {
      content->Hes[k] = NULL;
      content->Hes[k] = (realtype *) malloc(content->maxl*sizeof(realtype));
      if (content->Hes[k] == NULL) {
        SUNLinSolFree(S);
        content->last_flag = SUNLS_MEM_FAIL;
        return(SUNLS_MEM_FAIL);
      }
    }
  }
  
  /*   Givens rotation components */
  if (content->givens == NULL) {
    content->givens = (realtype *) malloc(2*content->maxl*sizeof(realtype));
    if (content->givens == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }
  
  /*    y and g vectors */
  if (content->yg == NULL) {
    content->yg = (realtype *) malloc((content->maxl+1)*sizeof(realtype));
    if (content->yg == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    cv vector for fused vector ops */
  if (content->cv == NULL) {
    content->cv = (realtype *) malloc((content->maxl+1)*sizeof(realtype));
    if (content->cv == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    Xv vector for fused vector ops */
  if (content->Xv == NULL) {
    content->Xv = (N_Vector *) malloc((content->maxl+1)*sizeof(N_Vector));
    if (content->Xv == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /* return with success */
  content->last_flag = SUNLS_SUCCESS;
  return(SUNLS_SUCCESS);
}